

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O2

int __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,float>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>>
          (exhaustive_solver<baryonyx::itm::minimize_tag,float> *this,int k,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
          *reduced_cost,int r_size)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  rc_data *prVar4;
  item *piVar5;
  uint uVar6;
  iterator iVar7;
  ulong uVar8;
  __normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::item_*,_std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::item>_>_>
  _Var9;
  int *piVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  rc_data *prVar16;
  size_type __new_size;
  int j;
  ulong uVar17;
  bool bVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  float z;
  undefined1 auVar23 [64];
  key_type local_3c;
  
  local_3c.bk_min = 0;
  local_3c.bk_max = 0;
  local_3c.k = k;
  iVar7 = std::
          _Rb_tree<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::constraint,_baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::constraint,_std::_Identity<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::constraint>,_std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::constraint>,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::constraint>_>
          ::find((_Rb_tree<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::constraint,_baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::constraint,_std::_Identity<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::constraint>,_std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::constraint>,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::constraint>_>
                  *)(this + 0x48),&local_3c);
  if (iVar7._M_node != (_Base_ptr)(this + 0x50)) {
    __new_size = (size_type)r_size;
    std::
    vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::item>_>
    ::resize((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_float>::item>_>
              *)this,__new_size);
    lVar3 = *(long *)this;
    uVar8 = (ulong)(uint)r_size;
    piVar10 = &((reduced_cost->_M_t).
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_false>
               ._M_head_impl)->id;
    for (lVar12 = 0; uVar8 << 4 != lVar12; lVar12 = lVar12 + 0x10) {
      *(float *)(lVar3 + lVar12) = ((rc_data *)(piVar10 + -1))->value;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)piVar10;
      piVar10 = piVar10 + 3;
      auVar21 = vshufps_avx(auVar20,auVar20,0xe1);
      uVar1 = vmovlps_avx(auVar21);
      *(undefined8 *)(lVar3 + 4 + lVar12) = uVar1;
      *(undefined4 *)(lVar3 + 0xc + lVar12) = 0;
    }
    iVar2 = *(int *)&iVar7._M_node[1].field_0x4;
    lVar3 = *(long *)(this + 0x18);
    prVar4 = (reduced_cost->_M_t).
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_false>
             ._M_head_impl;
    auVar22 = ZEXT1664(ZEXT816(0) << 0x40);
    prVar16 = prVar4;
    for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
      if (*(int *)(lVar3 + (long)iVar2 * 4 + uVar13 * 4) != 0) {
        auVar22 = ZEXT464((uint)(auVar22._0_4_ + prVar16->value));
      }
      prVar16 = prVar16 + 1;
    }
    uVar14 = 0;
    lVar12 = (long)iVar2 * 4 + __new_size * 4 + lVar3;
    for (uVar13 = 1; uVar13 != *(uint *)&iVar7._M_node[1]._M_parent; uVar13 = uVar13 + 1) {
      auVar23 = ZEXT1664(ZEXT816(0) << 0x40);
      prVar16 = prVar4;
      for (uVar17 = 0; uVar8 != uVar17; uVar17 = uVar17 + 1) {
        if (*(int *)(lVar12 + uVar17 * 4) != 0) {
          auVar23 = ZEXT464((uint)(auVar23._0_4_ + prVar16->value));
        }
        prVar16 = prVar16 + 1;
      }
      fVar19 = auVar22._0_4_;
      auVar21 = vminss_avx(auVar23._0_16_,auVar22._0_16_);
      auVar22 = ZEXT1664(auVar21);
      if (auVar23._0_4_ < fVar19) {
        uVar14 = uVar13 & 0xffffffff;
      }
      lVar12 = lVar12 + __new_size * 4;
    }
    lVar12 = *(long *)this;
    for (lVar11 = 0; uVar8 << 2 != lVar11; lVar11 = lVar11 + 4) {
      *(uint *)(lVar12 + 0xc + lVar11 * 4) =
           (uint)(*(int *)(lVar3 + (long)((int)uVar14 * r_size + iVar2) * 4 + lVar11) != 0);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,float>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>&,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (*(undefined8 *)this,*(undefined8 *)(this + 8));
    _Var9 = std::
            __find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,float>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_pred<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>&,int)::_lambda(auto:1_const&)_1_>>
                      (*(undefined8 *)this,*(undefined8 *)(this + 8));
    lVar3 = *(long *)this;
    piVar5 = *(item **)(this + 8);
    piVar10 = &((reduced_cost->_M_t).
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_false>
               ._M_head_impl)->id;
    puVar15 = (ulong *)(lVar3 + 4);
    lVar12 = (long)piVar5 - lVar3 >> 4;
    while (bVar18 = lVar12 != 0, lVar12 = lVar12 + -1, bVar18) {
      ((rc_data *)(piVar10 + -1))->value = *(float *)((long)puVar15 + -4);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *puVar15;
      puVar15 = puVar15 + 2;
      auVar21 = vshufps_avx(auVar21,auVar21,0xe1);
      uVar1 = vmovlps_avx(auVar21);
      *(undefined8 *)piVar10 = uVar1;
      piVar10 = piVar10 + 3;
    }
    if (_Var9._M_current == piVar5) {
      uVar6 = -(uint)(*(int *)(lVar3 + 0xc) == 0) | r_size;
    }
    else {
      uVar6 = (int)((ulong)((long)_Var9._M_current - lVar3) >> 4) - 1;
    }
    return uVar6;
  }
  details::fail_fast("Precondition","it_constraint != constraints.end()",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/exhaustive-solver.hpp"
                     ,"189");
}

Assistant:

int solve(int k, R& reduced_cost, int r_size)
    {
        const auto it_constraint = constraints.find(k);
        bx_expects(it_constraint != constraints.end());

        items.resize(r_size);
        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].factor = reduced_cost[i].f;
            items[i].result = 0;
        }

        Float z_best = 0;
        auto best = 0;
        auto start_solution = it_constraint->start;

        for (int j = 0; j != r_size; ++j)
            if (flat_constraints[start_solution + j])
                z_best += reduced_cost[j].value;

        for (auto i = 1; i != it_constraint->solutions; ++i) {
            start_solution = it_constraint->start + (i * r_size);

            Float z = 0;
            for (int j = 0; j != r_size; ++j)
                if (flat_constraints[start_solution + j])
                    z += reduced_cost[j].value;

            if (is_best_solution(z, z_best)) {
                z_best = z;
                best = i;
            }
        }

        start_solution = it_constraint->start + (best * r_size);
        for (int i = 0; i != r_size; ++i)
            items[i].result = flat_constraints[start_solution + i] ? 1 : 0;

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }